

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O3

btSoftBody *
btSoftBodyHelpers::CreatePatch
          (btSoftBodyWorldInfo *worldInfo,btVector3 *corner00,btVector3 *corner10,
          btVector3 *corner01,btVector3 *corner11,int resx,int resy,int fixeds,bool gendiags)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  btVector3 *x;
  btScalar *m;
  btSoftBody *this;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int node0;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint node_count;
  int node1;
  int iVar14;
  int iVar15;
  int iVar16;
  int node1_00;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  if (resy < 2 || resx < 2) {
    this = (btSoftBody *)0x0;
  }
  else {
    node_count = resy * resx;
    x = (btVector3 *)btAlignedAllocInternal((ulong)node_count << 4,0x10);
    m = (btScalar *)operator_new__((ulong)node_count * 4);
    iVar6 = resy + -1;
    lVar8 = 0;
    uVar10 = 0;
    do {
      fVar20 = (float)(int)uVar10 / (float)iVar6;
      fVar17 = (corner01->m_floats[2] - corner00->m_floats[2]) * fVar20 + corner00->m_floats[2];
      fVar1 = corner11->m_floats[2];
      fVar2 = corner10->m_floats[2];
      fVar18 = (float)*(undefined8 *)corner00->m_floats;
      fVar19 = (float)((ulong)*(undefined8 *)corner00->m_floats >> 0x20);
      fVar18 = ((float)*(undefined8 *)corner01->m_floats - fVar18) * fVar20 + fVar18;
      fVar19 = ((float)((ulong)*(undefined8 *)corner01->m_floats >> 0x20) - fVar19) * fVar20 +
               fVar19;
      uVar3 = *(undefined8 *)corner11->m_floats;
      fVar22 = (float)*(undefined8 *)corner10->m_floats;
      fVar23 = (float)((ulong)*(undefined8 *)corner10->m_floats >> 0x20);
      uVar13 = 0;
      lVar12 = lVar8;
      do {
        fVar21 = (float)(int)uVar13 / (float)(resx + -1);
        auVar4._4_4_ = fVar21 * ((((float)((ulong)uVar3 >> 0x20) - fVar23) * fVar20 + fVar23) -
                                fVar19) + fVar19;
        auVar4._0_4_ = fVar21 * ((((float)uVar3 - fVar22) * fVar20 + fVar22) - fVar18) + fVar18;
        auVar4._8_4_ = (((fVar1 - fVar2) * fVar20 + fVar2) - fVar17) * fVar21 + fVar17;
        auVar4._12_4_ = 0;
        *(undefined1 (*) [16])(x->m_floats + lVar12) = auVar4;
        *(undefined4 *)((long)m + lVar12) = 0x3f800000;
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + 4;
      } while ((uint)resx != uVar13);
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + (ulong)(uint)resx * 4;
    } while (uVar10 != (uint)resy);
    this = (btSoftBody *)btAlignedAllocInternal(0x690,0x10);
    btSoftBody::btSoftBody(this,worldInfo,node_count,x,m);
    if ((fixeds & 1U) != 0) {
      btSoftBody::setMass(this,0,0.0);
    }
    if ((fixeds & 2U) != 0) {
      btSoftBody::setMass(this,resx + -1,0.0);
    }
    if ((fixeds & 4U) != 0) {
      btSoftBody::setMass(this,iVar6 * resx,0.0);
    }
    if ((fixeds & 8U) != 0) {
      btSoftBody::setMass(this,resx + iVar6 * resx + -1,0.0);
    }
    btAlignedFreeInternal(x);
    operator_delete__(m);
    iVar9 = 1;
    iVar6 = 0;
    iVar7 = resx;
    iVar11 = 0;
    do {
      iVar5 = iVar11 + 1;
      iVar15 = 0;
      node1_00 = iVar7;
      do {
        iVar16 = iVar15 + 1;
        node0 = iVar6 + iVar15;
        iVar14 = node1_00;
        if (iVar16 < resx) {
          node1 = iVar9 + iVar15;
          btSoftBody::appendLink(this,node0,node1,(Material *)0x0,false);
          if (iVar5 < resy) {
            btSoftBody::appendLink(this,node0,node1_00,(Material *)0x0,false);
            if ((iVar15 + iVar11 & 1U) == 0) {
              btSoftBody::appendFace(this,node1_00,node0,node1,(Material *)0x0);
              btSoftBody::appendFace(this,node1_00,node1,node1_00 + 1,(Material *)0x0);
              node0 = node1;
            }
            else {
              iVar14 = node1_00 + 1;
              btSoftBody::appendFace(this,node0,node1,iVar14,(Material *)0x0);
              btSoftBody::appendFace(this,node0,iVar14,node1_00,(Material *)0x0);
            }
            if (gendiags) goto LAB_001eae7a;
          }
        }
        else if (iVar5 < resy) {
LAB_001eae7a:
          btSoftBody::appendLink(this,node0,iVar14,(Material *)0x0,false);
        }
        node1_00 = node1_00 + 1;
        iVar15 = iVar16;
      } while (resx != iVar16);
      iVar7 = iVar7 + resx;
      iVar9 = iVar9 + resx;
      iVar6 = iVar6 + resx;
      iVar11 = iVar5;
    } while (iVar5 != resy);
  }
  return this;
}

Assistant:

btSoftBody*		btSoftBodyHelpers::CreatePatch(btSoftBodyWorldInfo& worldInfo,const btVector3& corner00,
											   const btVector3& corner10,
											   const btVector3& corner01,
											   const btVector3& corner11,
											   int resx,
											   int resy,
											   int fixeds,
											   bool gendiags)
{
#define IDX(_x_,_y_)	((_y_)*rx+(_x_))
	/* Create nodes	*/ 
	if((resx<2)||(resy<2)) return(0);
	const int	rx=resx;
	const int	ry=resy;
	const int	tot=rx*ry;
	btVector3*	x=new btVector3[tot];
	btScalar*	m=new btScalar[tot];
	int iy;

	for(iy=0;iy<ry;++iy)
	{
		const btScalar	ty=iy/(btScalar)(ry-1);
		const btVector3	py0=lerp(corner00,corner01,ty);
		const btVector3	py1=lerp(corner10,corner11,ty);
		for(int ix=0;ix<rx;++ix)
		{
			const btScalar	tx=ix/(btScalar)(rx-1);
			x[IDX(ix,iy)]=lerp(py0,py1,tx);
			m[IDX(ix,iy)]=1;
		}
	}
	btSoftBody*		psb=new btSoftBody(&worldInfo,tot,x,m);
	if(fixeds&1)	psb->setMass(IDX(0,0),0);
	if(fixeds&2)	psb->setMass(IDX(rx-1,0),0);
	if(fixeds&4)	psb->setMass(IDX(0,ry-1),0);
	if(fixeds&8)	psb->setMass(IDX(rx-1,ry-1),0);
	delete[] x;
	delete[] m;
	/* Create links	and faces */ 
	for(iy=0;iy<ry;++iy)
	{
		for(int ix=0;ix<rx;++ix)
		{
			const int	idx=IDX(ix,iy);
			const bool	mdx=(ix+1)<rx;
			const bool	mdy=(iy+1)<ry;
			if(mdx) psb->appendLink(idx,IDX(ix+1,iy));
			if(mdy) psb->appendLink(idx,IDX(ix,iy+1));
			if(mdx&&mdy)
			{
				if((ix+iy)&1)
				{
					psb->appendFace(IDX(ix,iy),IDX(ix+1,iy),IDX(ix+1,iy+1));
					psb->appendFace(IDX(ix,iy),IDX(ix+1,iy+1),IDX(ix,iy+1));
					if(gendiags)
					{
						psb->appendLink(IDX(ix,iy),IDX(ix+1,iy+1));
					}
				}
				else
				{
					psb->appendFace(IDX(ix,iy+1),IDX(ix,iy),IDX(ix+1,iy));
					psb->appendFace(IDX(ix,iy+1),IDX(ix+1,iy),IDX(ix+1,iy+1));
					if(gendiags)
					{
						psb->appendLink(IDX(ix+1,iy),IDX(ix,iy+1));
					}
				}
			}
		}
	}
	/* Finished		*/ 
#undef IDX
	return(psb);
}